

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

iterator __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::erase(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,iterator pos)

{
  Iter<false> *pIVar1;
  uint8_t *puVar2;
  NodePtr pDVar3;
  iterator iVar4;
  iterator pos_local;
  
  puVar2 = pos.mInfo;
  pDVar3 = pos.mKeyVals;
  pos_local.mKeyVals = pDVar3;
  pos_local.mInfo = puVar2;
  shiftDown(this,((long)pDVar3 - (long)this->mKeyVals) / 0x28);
  this->mNumElements = this->mNumElements - 1;
  if (*puVar2 == '\0') {
    pIVar1 = Iter<false>::operator++(&pos_local);
    pDVar3 = pIVar1->mKeyVals;
    puVar2 = pIVar1->mInfo;
  }
  iVar4.mInfo = puVar2;
  iVar4.mKeyVals = pDVar3;
  return iVar4;
}

Assistant:

iterator erase(iterator pos) {
        ROBIN_HOOD_TRACE(this)
        // we assume that pos always points to a valid entry, and not end().
        auto const idx = static_cast<size_t>(pos.mKeyVals - mKeyVals);

        shiftDown(idx);
        --mNumElements;

        if (*pos.mInfo) {
            // we've backward shifted, return this again
            return pos;
        }

        // no backward shift, return next element
        return ++pos;
    }